

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall
GlobOpt::ProcessFieldKills
          (GlobOpt *this,Instr *instr,BVSparse<Memory::JitArenaAllocator> *bv,bool inGlobOpt)

{
  SymID stackSymID;
  code *pcVar1;
  bool bVar2;
  short sVar3;
  DWORD DVar4;
  int iVar5;
  RegOpnd *pRVar6;
  StackSym *pSVar7;
  IndirOpnd *pIVar8;
  Opnd *pOVar9;
  JitArenaAllocator *pJVar10;
  BVSparse<Memory::JitArenaAllocator> *pBVar11;
  SymOpnd *pSVar12;
  PropertySym *pPVar13;
  undefined4 *puVar14;
  HelperCallOpnd *pHVar15;
  ScriptContextInfo *pSVar16;
  undefined4 extraout_var;
  TrackAllocData local_b8;
  code *local_90;
  undefined8 local_88;
  TrackAllocData local_80;
  JnHelperMethod local_54;
  Sym *pSStack_50;
  JnHelperMethod fnHelper;
  Sym *sym;
  PropertySym *slotArraySym;
  Sym *sym_2;
  Sym *sym_1;
  Opnd *dstOpnd;
  BVSparse<Memory::JitArenaAllocator> *pBStack_20;
  bool inGlobOpt_local;
  BVSparse<Memory::JitArenaAllocator> *bv_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  dstOpnd._7_1_ = inGlobOpt;
  pBStack_20 = bv;
  bv_local = (BVSparse<Memory::JitArenaAllocator> *)instr;
  instr_local = (Instr *)this;
  bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(bv);
  if (bVar2) {
    bVar2 = IsLoopPrePass(this);
    if (!bVar2) {
      return;
    }
    if ((*(ushort *)&this->rootLoopPrePass->field_0x178 >> 7 & 1) != 0) {
      return;
    }
  }
  if (*(short *)&bv_local[1].alloc == 0x1de) {
    return;
  }
  if (*(short *)&bv_local[1].alloc == 0x1df) {
    return;
  }
  sym_1 = (Sym *)IR::Instr::GetDst((Instr *)bv_local);
  if (sym_1 != (Sym *)0x0) {
    bVar2 = IR::Opnd::IsRegOpnd((Opnd *)sym_1);
    if (bVar2) {
      pRVar6 = IR::Opnd::AsRegOpnd((Opnd *)sym_1);
      sym_2 = &pRVar6->m_sym->super_Sym;
      bVar2 = Sym::IsStackSym(sym_2);
      if (bVar2) {
        pSVar7 = Sym::AsStackSym(sym_2);
        KillLiveFields(this,pSVar7,pBStack_20);
      }
    }
    else {
      bVar2 = IR::Opnd::IsSymOpnd((Opnd *)sym_1);
      if (bVar2) {
        pSVar12 = IR::Opnd::AsSymOpnd((Opnd *)sym_1);
        slotArraySym = (PropertySym *)pSVar12->m_sym;
        bVar2 = Sym::IsStackSym((Sym *)slotArraySym);
        if (bVar2) {
          pSVar7 = Sym::AsStackSym(&slotArraySym->super_Sym);
          KillLiveFields(this,pSVar7,pBStack_20);
        }
        else {
          bVar2 = Sym::IsPropertySym(&slotArraySym->super_Sym);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar14 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                               ,0x144,"(sym->IsPropertySym())","sym->IsPropertySym()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar14 = 0;
          }
          if (((*(short *)&bv_local[1].alloc == 0x53) || (*(short *)&bv_local[1].alloc == 0x55)) ||
             (*(short *)&bv_local[1].alloc == 0x7a)) {
            pPVar13 = Sym::AsPropertySym(&slotArraySym->super_Sym);
            stackSymID = (pPVar13->m_stackSym->super_Sym).m_id;
            DVar4 = Js::DynamicObject::GetOffsetOfAuxSlots();
            sym = &PropertySym::Find(stackSymID,DVar4 >> 3,(Func *)bv_local[1].head)->super_Sym;
            if ((PropertySym *)sym != (PropertySym *)0x0) {
              BVSparse<Memory::JitArenaAllocator>::Clear
                        (pBStack_20,(((PropertySym *)sym)->super_Sym).m_id);
            }
          }
        }
      }
    }
  }
  bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBStack_20);
  if (bVar2) {
    bVar2 = IsLoopPrePass(this);
    if (!bVar2) {
      return;
    }
    if ((*(ushort *)&this->rootLoopPrePass->field_0x178 >> 7 & 1) != 0) {
      return;
    }
  }
  sVar3 = (short)*(undefined4 *)&bv_local[1].alloc;
  if (3 < (ushort)(sVar3 - 0x53U)) {
    if (sVar3 == 0x57) goto LAB_00600ab4;
    if ((((sVar3 != 0x70) && (sVar3 != 0x72)) &&
        ((sVar3 != 0x76 && ((sVar3 != 0x78 && (sVar3 != 0x7a)))))) && (sVar3 != 0x7e)) {
      if ((ushort)(sVar3 - 0x80U) < 4) {
LAB_00600a4c:
        pOVar9 = IR::Instr::GetSrc1((Instr *)bv_local);
        pSVar12 = IR::Opnd::AsSymOpnd(pOVar9);
        pSStack_50 = pSVar12->m_sym;
        pPVar13 = Sym::AsPropertySym(pSStack_50);
        KillLiveFields(this,pPVar13,pBStack_20);
        if ((dstOpnd._7_1_ & 1) == 0) {
          return;
        }
        pPVar13 = Sym::AsPropertySym(pSStack_50);
        AddToPropertiesWrittenTo(this,pPVar13->m_propertyId);
        KillAllObjectTypes(this,pBStack_20);
        return;
      }
      if (1 < (ushort)(sVar3 - 0x88U)) {
        if ((ushort)(sVar3 - 0x8aU) < 2) goto LAB_00600a4c;
        if ((sVar3 == 0x9a) || (sVar3 == 0x9c)) {
LAB_00600840:
          if (sym_1 == (Sym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar14 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                               ,0x160,"(dstOpnd != nullptr)","dstOpnd != nullptr");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar14 = 0;
          }
          KillLiveFields(this,this->lengthEquivBv,pBStack_20);
          pIVar8 = IR::Opnd::AsIndirOpnd((Opnd *)sym_1);
          pOVar9 = IR::Instr::GetSrc1((Instr *)bv_local);
          KillLiveElems(this,pIVar8,pOVar9,pBStack_20,(bool)(dstOpnd._7_1_ & 1),
                        (Func *)bv_local[1].head);
          if ((dstOpnd._7_1_ & 1) == 0) {
            return;
          }
          KillObjectHeaderInlinedTypeSyms(this,this->currentBlock,false,0xffffffff);
          return;
        }
        if ((ushort)(sVar3 - 0xa4U) < 2) {
          if (sym_1 == (Sym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar14 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                               ,0x175,"(dstOpnd != nullptr)","dstOpnd != nullptr");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar14 = 0;
          }
          pOVar9 = IR::Instr::GetSrc1((Instr *)bv_local);
          pIVar8 = IR::Opnd::AsIndirOpnd(pOVar9);
          KillLiveElems(this,pIVar8,(Opnd *)0x0,pBStack_20,(bool)(dstOpnd._7_1_ & 1),
                        (Func *)bv_local[1].head);
          return;
        }
        if ((ushort)(sVar3 - 0xb1U) < 3) {
LAB_00601075:
          if ((dstOpnd._7_1_ & 1) == 0) {
            return;
          }
          KillLiveFields(this,this->slotSyms,pBStack_20);
          return;
        }
        if (sVar3 == 0xcc) {
LAB_0060115d:
          if ((dstOpnd._7_1_ & 1) == 0) {
            return;
          }
          KillAllObjectTypes(this,pBStack_20);
          return;
        }
        if ((ushort)(sVar3 - 0x118U) < 2) {
LAB_00600ab4:
          pOVar9 = IR::Instr::GetDst((Instr *)bv_local);
          pSVar12 = IR::Opnd::AsSymOpnd(pOVar9);
          pSStack_50 = pSVar12->m_sym;
          pPVar13 = Sym::AsPropertySym(pSStack_50);
          KillLiveFields(this,pPVar13,pBStack_20);
          if ((dstOpnd._7_1_ & 1) == 0) {
            return;
          }
          pPVar13 = Sym::AsPropertySym(pSStack_50);
          AddToPropertiesWrittenTo(this,pPVar13->m_propertyId);
          KillAllObjectTypes(this,pBStack_20);
          return;
        }
        if ((sVar3 == 0x127) || (sVar3 == 0x129)) goto LAB_00600c4e;
        if (1 < (ushort)(sVar3 - 0x132U)) {
          if (1 < (ushort)(sVar3 - 0x152U)) {
            if ((ushort)(sVar3 - 0x154U) < 3) {
              pIVar8 = IR::Opnd::AsIndirOpnd((Opnd *)sym_1);
              pOVar9 = IR::Instr::GetSrc1((Instr *)bv_local);
              KillLiveElems(this,pIVar8,pOVar9,pBStack_20,(bool)(dstOpnd._7_1_ & 1),
                            (Func *)bv_local[1].head);
              if ((dstOpnd._7_1_ & 1) == 0) {
                return;
              }
              KillObjectHeaderInlinedTypeSyms(this,this->currentBlock,false,0xffffffff);
              return;
            }
            if (sVar3 != 0x157) {
              if (sVar3 == 0x15a) goto LAB_00601075;
              if (sVar3 == 0x1bb) {
                pOVar9 = IR::Instr::GetSrc1((Instr *)bv_local);
                pHVar15 = IR::Opnd::AsHelperCallOpnd(pOVar9);
                local_54 = pHVar15->m_fnHelper;
                switch(local_54) {
                case HelperArray_Concat:
                case HelperArray_Slice:
                  if (((dstOpnd._7_1_ & 1) != 0) &&
                     (this->objectTypeSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
                    if ((this->currentBlock->globOptData).maybeWrittenTypeSyms ==
                        (BVSparse<Memory::JitArenaAllocator> *)0x0) {
                      pJVar10 = this->alloc;
                      Memory::TrackAllocData::CreateTrackAllocData
                                (&local_b8,
                                 (type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                                 0xffffffffffffffff,
                                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                                 ,0x211);
                      pJVar10 = (JitArenaAllocator *)
                                Memory::
                                ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                                TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                                *)pJVar10,&local_b8);
                      pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)
                                new<Memory::JitArenaAllocator>(0x20,pJVar10,0x4e98c0);
                      BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar11,this->alloc);
                      (this->currentBlock->globOptData).maybeWrittenTypeSyms = pBVar11;
                    }
                    BVSparse<Memory::JitArenaAllocator>::Or
                              ((this->currentBlock->globOptData).maybeWrittenTypeSyms,
                               this->objectTypeSyms);
                  }
                  break;
                case HelperArray_Shift:
                case HelperArray_Splice:
                case HelperArray_Unshift:
                  if ((this->lengthEquivBv != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
                     (bVar2 = Func::GetThisOrParentInlinerHasArguments((Func *)bv_local[1].head),
                     !bVar2)) {
                    KillLiveFields(this,this->lengthEquivBv,pBStack_20);
                  }
                case HelperArray_Reverse:
                  bVar2 = Func::GetThisOrParentInlinerHasArguments((Func *)bv_local[1].head);
                  if (bVar2) {
                    KillAllFields(this,pBStack_20);
                    SetAnyPropertyMayBeWrittenTo(this);
                  }
                  else if ((dstOpnd._7_1_ & 1) != 0) {
                    KillAllObjectTypes(this,pBStack_20);
                  }
                  break;
                case HelperString_Match:
                case HelperString_Replace:
                case HelperString_Search:
                case HelperString_Split:
                case HelperRegExp_SplitResultUsed:
                case HelperRegExp_SplitResultUsedAndMayBeTemp:
                case HelperRegExp_SplitResultNotUsed:
                case HelperRegExp_MatchResultUsed:
                case HelperRegExp_MatchResultUsedAndMayBeTemp:
                case HelperRegExp_MatchResultNotUsed:
                case HelperRegExp_Exec:
                case HelperRegExp_ExecResultUsed:
                case HelperRegExp_ExecResultUsedAndMayBeTemp:
                case HelperRegExp_ExecResultNotUsed:
                case HelperRegExp_ReplaceStringResultUsed:
                case HelperRegExp_ReplaceStringResultNotUsed:
                case HelperRegExp_SymbolSearch:
                  KillAllFields(this,pBStack_20);
                }
                return;
              }
              if (sVar3 == 0x1e9) {
                pOVar9 = IR::Instr::GetSrc1((Instr *)bv_local);
                if (pOVar9 == (Opnd *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar14 = 1;
                  bVar2 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                                     ,0x239,"(instr->GetSrc1())","instr->GetSrc1()");
                  if (!bVar2) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar14 = 0;
                }
                pOVar9 = IR::Instr::GetSrc1((Instr *)bv_local);
                pSVar16 = Func::GetScriptContextInfo(this->func);
                iVar5 = (*pSVar16->_vptr_ScriptContextInfo[0x19])();
                bVar2 = IR::AddrOpnd::IsEqualAddr(pOVar9,(void *)CONCAT44(extraout_var,iVar5));
                if (bVar2) {
                  return;
                }
              }
              else {
                if ((ushort)(sVar3 - 0x1f7U) < 2) goto LAB_00600c4e;
                if (sVar3 != 0x215) {
                  if (sVar3 != 0x22c) {
                    if ((ushort)(sVar3 - 0x249U) < 2) {
                      bVar2 = IR::Instr::UsesAllFields((Instr *)bv_local);
                      if (bVar2) {
                        AssertCount = AssertCount + 1;
                        Js::Throw::LogAssert();
                        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                        *puVar14 = 1;
                        bVar2 = Js::Throw::ReportAssert
                                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                                           ,0x1e3,"(!instr->UsesAllFields())",
                                           "!instr->UsesAllFields()");
                        if (!bVar2) {
                          pcVar1 = (code *)invalidInstructionException();
                          (*pcVar1)();
                        }
                        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                        *puVar14 = 0;
                      }
                      KillLiveFields(this,this->argumentsEquivBv,pBStack_20);
                      KillLiveFields(this,this->callerEquivBv,pBStack_20);
                      return;
                    }
                    if (1 < (ushort)(sVar3 - 0x269U)) {
                      bVar2 = IR::Instr::UsesAllFields((Instr *)bv_local);
                      if (!bVar2) {
                        return;
                      }
                      KillAllFields(this,pBStack_20);
                      return;
                    }
                    bVar2 = Func::GetThisOrParentInlinerHasArguments((Func *)bv_local[1].head);
                    if (bVar2) {
                      KillAllFields(this,pBStack_20);
                      SetAnyPropertyMayBeWrittenTo(this);
                      return;
                    }
                    KillLiveFields(this,this->lengthEquivBv,pBStack_20);
                    if ((dstOpnd._7_1_ & 1) == 0) {
                      return;
                    }
                    KillAllObjectTypes(this,pBStack_20);
                    return;
                  }
                  goto LAB_00600840;
                }
              }
            }
            goto LAB_0060115d;
          }
          goto LAB_00600ab4;
        }
      }
      if (((dstOpnd._7_1_ & 1) != 0) &&
         (KillObjectHeaderInlinedTypeSyms(this,this->currentBlock,false,0xffffffff),
         this->objectTypeSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
        if ((this->currentBlock->globOptData).maybeWrittenTypeSyms ==
            (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          pJVar10 = this->alloc;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_80,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                     0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                     ,0x1a3);
          pJVar10 = (JitArenaAllocator *)
                    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                    TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    *)pJVar10,&local_80);
          local_90 = Memory::JitArenaAllocator::Alloc;
          local_88 = 0;
          pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)
                    new<Memory::JitArenaAllocator>(0x20,pJVar10,0x4e98c0);
          BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar11,this->alloc);
          (this->currentBlock->globOptData).maybeWrittenTypeSyms = pBVar11;
        }
        BVSparse<Memory::JitArenaAllocator>::Or
                  ((this->currentBlock->globOptData).maybeWrittenTypeSyms,this->objectTypeSyms);
      }
    }
  }
LAB_00600c4e:
  if (sym_1 == (Sym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x1bc,"(dstOpnd != nullptr)","dstOpnd != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 0;
  }
  pSVar12 = IR::Opnd::AsSymOpnd((Opnd *)sym_1);
  pSStack_50 = pSVar12->m_sym;
  if ((dstOpnd._7_1_ & 1) != 0) {
    pPVar13 = Sym::AsPropertySym(pSStack_50);
    AddToPropertiesWrittenTo(this,pPVar13->m_propertyId);
  }
  if ((((dstOpnd._7_1_ & 1) != 0) &&
      ((pPVar13 = Sym::AsPropertySym(pSStack_50), pPVar13->m_propertyId == 0x18e ||
       (pPVar13 = Sym::AsPropertySym(pSStack_50), pPVar13->m_propertyId == 0x178)))) ||
     (bVar2 = IR::Instr::CallsAccessor((Instr *)bv_local,(PropertySymOpnd *)0x0), bVar2)) {
    KillAllFields(this,pBStack_20);
  }
  else {
    pPVar13 = Sym::AsPropertySym(pSStack_50);
    KillLiveFields(this,pPVar13,pBStack_20);
  }
  return;
}

Assistant:

void
GlobOpt::ProcessFieldKills(IR::Instr *instr, BVSparse<JitArenaAllocator> *bv, bool inGlobOpt)
{
    if (bv->IsEmpty() && (!this->IsLoopPrePass() || this->rootLoopPrePass->allFieldsKilled))
    {
        return;
    }

    if (instr->m_opcode == Js::OpCode::FromVar || instr->m_opcode == Js::OpCode::Conv_Prim)
    {
        return;
    }

    IR::Opnd * dstOpnd = instr->GetDst();
    if (dstOpnd)
    {
        if (dstOpnd->IsRegOpnd())
        {
            Sym * sym = dstOpnd->AsRegOpnd()->m_sym;
            if (sym->IsStackSym())
            {
                KillLiveFields(sym->AsStackSym(), bv);
            }
        }
        else if (dstOpnd->IsSymOpnd())
        {
            Sym * sym = dstOpnd->AsSymOpnd()->m_sym;
            if (sym->IsStackSym())
            {
                KillLiveFields(sym->AsStackSym(), bv);
            }
            else
            {
                Assert(sym->IsPropertySym());
                if (instr->m_opcode == Js::OpCode::InitLetFld || instr->m_opcode == Js::OpCode::InitConstFld || instr->m_opcode == Js::OpCode::InitFld)
                {
                    // These can grow the aux slot of the activation object.
                    // We need to kill the slot array sym as well.
                    PropertySym * slotArraySym = PropertySym::Find(sym->AsPropertySym()->m_stackSym->m_id,
                        (Js::DynamicObject::GetOffsetOfAuxSlots())/sizeof(Js::Var) /*, PropertyKindSlotArray */, instr->m_func);
                    if (slotArraySym)
                    {
                        bv->Clear(slotArraySym->m_id);
                    }
                }
            }
        }
    }

    if (bv->IsEmpty() && (!this->IsLoopPrePass() || this->rootLoopPrePass->allFieldsKilled))
    {
        return;
    }

    Sym *sym;
    IR::JnHelperMethod fnHelper;
    switch(instr->m_opcode)
    {
    case Js::OpCode::StElemC:
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        Assert(dstOpnd != nullptr);
        KillLiveFields(this->lengthEquivBv, bv);
        KillLiveElems(dstOpnd->AsIndirOpnd(), instr->GetSrc1(), bv, inGlobOpt, instr->m_func);
        if (inGlobOpt)
        {
            KillObjectHeaderInlinedTypeSyms(this->currentBlock, false);
        }
        break;

    case Js::OpCode::InitComputedProperty:
    case Js::OpCode::InitGetElemI:
    case Js::OpCode::InitSetElemI:
        KillLiveElems(dstOpnd->AsIndirOpnd(), instr->GetSrc1(), bv, inGlobOpt, instr->m_func);
        if (inGlobOpt)
        {
            KillObjectHeaderInlinedTypeSyms(this->currentBlock, false);
        }
        break;

    case Js::OpCode::DeleteElemI_A:
    case Js::OpCode::DeleteElemIStrict_A:
        Assert(dstOpnd != nullptr);
        KillLiveElems(instr->GetSrc1()->AsIndirOpnd(), nullptr, bv, inGlobOpt, instr->m_func);
        break;

    case Js::OpCode::DeleteFld:
    case Js::OpCode::DeleteRootFld:
    case Js::OpCode::DeleteFldStrict:
    case Js::OpCode::DeleteRootFldStrict:
    case Js::OpCode::ScopedDeleteFld:
    case Js::OpCode::ScopedDeleteFldStrict:
        sym = instr->GetSrc1()->AsSymOpnd()->m_sym;
        KillLiveFields(sym->AsPropertySym(), bv);
        if (inGlobOpt)
        {
            AddToPropertiesWrittenTo(sym->AsPropertySym()->m_propertyId);
            this->KillAllObjectTypes(bv);
        }
        break;

    case Js::OpCode::InitSetFld:
    case Js::OpCode::InitGetFld:
    case Js::OpCode::InitClassMember:
    case Js::OpCode::InitClassMemberGet:
    case Js::OpCode::InitClassMemberSet:
        sym = instr->GetDst()->AsSymOpnd()->m_sym;
        KillLiveFields(sym->AsPropertySym(), bv);
        if (inGlobOpt)
        {
            AddToPropertiesWrittenTo(sym->AsPropertySym()->m_propertyId);
            this->KillAllObjectTypes(bv);
        }
        break;

    case Js::OpCode::ConsoleScopedStFld:
    case Js::OpCode::ConsoleScopedStFldStrict:
    case Js::OpCode::ScopedStFld:
    case Js::OpCode::ScopedStFldStrict:
        // This is already taken care of for FastFld opcodes

        if (inGlobOpt)
        {
            KillObjectHeaderInlinedTypeSyms(this->currentBlock, false);
            if (this->objectTypeSyms)
            {
                if (this->currentBlock->globOptData.maybeWrittenTypeSyms == nullptr)
                {
                    this->currentBlock->globOptData.maybeWrittenTypeSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
                }
                this->currentBlock->globOptData.maybeWrittenTypeSyms->Or(this->objectTypeSyms);
            }
        }

        // fall through

    case Js::OpCode::InitFld:
    case Js::OpCode::InitConstFld:
    case Js::OpCode::InitLetFld:
    case Js::OpCode::InitRootFld:
    case Js::OpCode::InitRootConstFld:
    case Js::OpCode::InitRootLetFld:
#if !FLOATVAR
    case Js::OpCode::StSlotBoxTemp:
#endif
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
    case Js::OpCode::StSuperFld:
    case Js::OpCode::StSuperFldStrict:
        Assert(dstOpnd != nullptr);
        sym = dstOpnd->AsSymOpnd()->m_sym;
        if (inGlobOpt)
        {
            AddToPropertiesWrittenTo(sym->AsPropertySym()->m_propertyId);
        }
        if ((inGlobOpt && (sym->AsPropertySym()->m_propertyId == Js::PropertyIds::valueOf || sym->AsPropertySym()->m_propertyId == Js::PropertyIds::toString)) ||
            instr->CallsAccessor())
        {
            // If overriding valueof/tostring, we might have expected a previous LdFld to bailout on implicitCalls but didn't.
            // CSE's for example would have expected a bailout. Clear all fields to prevent optimizing across.
            this->KillAllFields(bv);
        }
        else
        {
            KillLiveFields(sym->AsPropertySym(), bv);
        }
        break;

    case Js::OpCode::InlineArrayPush:
    case Js::OpCode::InlineArrayPop:
        if(instr->m_func->GetThisOrParentInlinerHasArguments())
        {
            this->KillAllFields(bv);
            this->SetAnyPropertyMayBeWrittenTo();
        }
        else
        {
            KillLiveFields(this->lengthEquivBv, bv);
            if (inGlobOpt)
            {
                // Deleting an item, or pushing a property to a non-array, may change object layout
                KillAllObjectTypes(bv);
            }
        }
        break;

    case Js::OpCode::InlineeStart:
    case Js::OpCode::InlineeEnd:
        Assert(!instr->UsesAllFields());

        // Kill all live 'arguments' and 'caller' fields, as 'inlineeFunction.arguments' and 'inlineeFunction.caller'
        // cannot be copy-propped across different instances of the same inlined function.
        KillLiveFields(argumentsEquivBv, bv);
        KillLiveFields(callerEquivBv, bv);
        break;

    case Js::OpCode::CallDirect:
        fnHelper = instr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper;

        switch (fnHelper)
        {
            case IR::JnHelperMethod::HelperArray_Shift:
            case IR::JnHelperMethod::HelperArray_Splice:
            case IR::JnHelperMethod::HelperArray_Unshift:
                // Kill length field for built-ins that can update it.
                if (nullptr != this->lengthEquivBv)
                {
                    // If has arguments, all fields are killed in fall through
                    if (!instr->m_func->GetThisOrParentInlinerHasArguments())
                    {
                        KillLiveFields(this->lengthEquivBv, bv);
                    }
                }
                // fall through

            case IR::JnHelperMethod::HelperArray_Reverse:
                if (instr->m_func->GetThisOrParentInlinerHasArguments())
                {
                    this->KillAllFields(bv);
                    this->SetAnyPropertyMayBeWrittenTo();
                }
                else if (inGlobOpt)
                {
                    // Deleting an item may change object layout
                    KillAllObjectTypes(bv);
                }
                break;

            case IR::JnHelperMethod::HelperArray_Slice:
            case IR::JnHelperMethod::HelperArray_Concat:
                if (inGlobOpt && this->objectTypeSyms)
                {
                    if (this->currentBlock->globOptData.maybeWrittenTypeSyms == nullptr)
                    {
                        this->currentBlock->globOptData.maybeWrittenTypeSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
                    }
                    this->currentBlock->globOptData.maybeWrittenTypeSyms->Or(this->objectTypeSyms);
                }
                break;

            case IR::JnHelperMethod::HelperRegExp_Exec:
            case IR::JnHelperMethod::HelperRegExp_ExecResultNotUsed:
            case IR::JnHelperMethod::HelperRegExp_ExecResultUsed:
            case IR::JnHelperMethod::HelperRegExp_ExecResultUsedAndMayBeTemp:
            case IR::JnHelperMethod::HelperRegExp_MatchResultNotUsed:
            case IR::JnHelperMethod::HelperRegExp_MatchResultUsed:
            case IR::JnHelperMethod::HelperRegExp_MatchResultUsedAndMayBeTemp:
            case IR::JnHelperMethod::HelperRegExp_ReplaceStringResultUsed:
            case IR::JnHelperMethod::HelperRegExp_ReplaceStringResultNotUsed:
            case IR::JnHelperMethod::HelperRegExp_SplitResultNotUsed:
            case IR::JnHelperMethod::HelperRegExp_SplitResultUsed:
            case IR::JnHelperMethod::HelperRegExp_SplitResultUsedAndMayBeTemp:
            case IR::JnHelperMethod::HelperRegExp_SymbolSearch:
            case IR::JnHelperMethod::HelperString_Match:
            case IR::JnHelperMethod::HelperString_Search:
            case IR::JnHelperMethod::HelperString_Split:
            case IR::JnHelperMethod::HelperString_Replace:
                // Consider: We may not need to kill all fields here.
                // We need to kill all the built-in properties that can be written, though, and there are a lot of those.
                this->KillAllFields(bv);
                break;
        }
        break;

    case Js::OpCode::LdHeapArguments:
    case Js::OpCode::LdLetHeapArguments:
    case Js::OpCode::LdHeapArgsCached:
    case Js::OpCode::LdLetHeapArgsCached:
        if (inGlobOpt) {
            this->KillLiveFields(this->slotSyms, bv);
        }
        break;

    case Js::OpCode::NewClassProto:
        Assert(instr->GetSrc1());
        if (IR::AddrOpnd::IsEqualAddr(instr->GetSrc1(), (void*)func->GetScriptContextInfo()->GetObjectPrototypeAddr()))
        {
            // No extends operand, the proto parent is the Object prototype
            break;
        }
        // Fall through
    case Js::OpCode::InitProto:
    case Js::OpCode::NewScObjectNoCtor:
    case Js::OpCode::NewScObjectNoCtorFull:
        if (inGlobOpt)
        {
            // Opcodes that make an object into a prototype may break object-header-inlining and final type opt.
            // Kill all known object layouts.
            KillAllObjectTypes(bv);
        }
        break;

    default:
        if (instr->UsesAllFields())
        {
            // This also kills all property type values, as the same bit-vector tracks those stack syms.
            this->KillAllFields(bv);
        }
        break;
    }
}